

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDSec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int fIgnoreNames;
  int c;
  int nArgcNew;
  char **pArgvNew;
  int fDelete2;
  int fDelete1;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk1;
  Abc_Ntk_t *pNtk;
  Fra_Sec_t *pSecPar;
  Fra_Sec_t SecPar;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk = (Abc_Ntk_t *)&pSecPar;
  SecPar._112_8_ = argv;
  pNtk1 = Abc_FrameReadNtk(pAbc);
  Fra_SecSetDefaultParams((Fra_Sec_t *)pNtk);
  pNtk->nObjCounts[1] = 0;
  bVar1 = false;
  Extra_UtilGetoptReset();
LAB_0023a07f:
  do {
    iVar2 = Extra_UtilGetopt(argc,(char **)SecPar._112_8_,"FTarmfnwvh");
    if (iVar2 == -1) {
      iVar2 = Abc_NtkPrepareTwoNtks
                        (_stdout,pNtk1,(char **)(SecPar._112_8_ + (long)globalUtilOptind * 8),
                         argc - globalUtilOptind,&pNtk2,(Abc_Ntk_t **)&fDelete2,
                         (int *)((long)&pArgvNew + 4),(int *)&pArgvNew);
      if (iVar2 == 0) {
        return 1;
      }
      iVar2 = Abc_NtkLatchNum(pNtk2);
      if ((iVar2 != 0) && (iVar2 = Abc_NtkLatchNum(_fDelete2), iVar2 != 0)) {
        if (bVar1) {
          if (pArgvNew._4_4_ == 0) {
            pNtk2 = Abc_NtkStrash(pNtk2,0,1,0);
            pArgvNew._4_4_ = 1;
          }
          if ((int)pArgvNew == 0) {
            _fDelete2 = Abc_NtkStrash(_fDelete2,0,1,0);
            pArgvNew._0_4_ = 1;
          }
          Abc_NtkShortNames(pNtk2);
          Abc_NtkShortNames(_fDelete2);
        }
        Abc_NtkDarSec(pNtk2,_fDelete2,(Fra_Sec_t *)pNtk);
        if (pArgvNew._4_4_ != 0) {
          Abc_NtkDelete(pNtk2);
        }
        if ((int)pArgvNew != 0) {
          Abc_NtkDelete(_fDelete2);
        }
        return 0;
      }
      if (pArgvNew._4_4_ != 0) {
        Abc_NtkDelete(pNtk2);
      }
      if ((int)pArgvNew != 0) {
        Abc_NtkDelete(_fDelete2);
      }
      Abc_Print(-1,"The network has no latches. Used combinational command \"cec\".\n");
      return 0;
    }
    switch(iVar2) {
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_0023a405;
      }
      iVar2 = atoi(*(char **)(SecPar._112_8_ + (long)globalUtilOptind * 8));
      *(int *)&pNtk->pName = iVar2;
      iVar2 = *(int *)&pNtk->pName;
      break;
    default:
      goto LAB_0023a405;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_0023a405;
      }
      iVar2 = atoi(*(char **)(SecPar._112_8_ + (long)globalUtilOptind * 8));
      pNtk->nObjCounts[1] = iVar2;
      iVar2 = pNtk->nObjCounts[1];
      break;
    case 0x61:
      *(uint *)&pNtk->vPis = *(uint *)&pNtk->vPis ^ 1;
      goto LAB_0023a07f;
    case 0x66:
      *(uint *)((long)&pNtk->vPos + 4) = *(uint *)((long)&pNtk->vPos + 4) ^ 1;
      goto LAB_0023a07f;
    case 0x6d:
      *(uint *)&pNtk->vPos = *(uint *)&pNtk->vPos ^ 1;
      goto LAB_0023a07f;
    case 0x6e:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_0023a07f;
    case 0x72:
      *(uint *)((long)&pNtk->vPis + 4) = *(uint *)((long)&pNtk->vPis + 4) ^ 1;
      goto LAB_0023a07f;
    case 0x76:
      *(uint *)((long)&pNtk->vLtlProperties + 4) = *(uint *)((long)&pNtk->vLtlProperties + 4) ^ 1;
      goto LAB_0023a07f;
    case 0x77:
      pNtk->nObjCounts[0] = pNtk->nObjCounts[0] ^ 1;
      goto LAB_0023a07f;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 0) {
LAB_0023a405:
      Abc_Print(-2,"usage: dsec [-F num] [-T num] [-armfnwvh] <file1> <file2>\n");
      Abc_Print(-2,"\t         performs inductive sequential equivalence checking\n");
      Abc_Print(-2,"\t-F num : the limit on the depth of induction [default = %d]\n",
                (ulong)*(uint *)&pNtk->pName);
      Abc_Print(-2,"\t-T num : the approximate runtime limit (in seconds) [default = %d]\n",
                (ulong)(uint)pNtk->nObjCounts[1]);
      pcVar3 = "no";
      if (*(int *)&pNtk->vPis != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-a     : toggles the use of phase abstraction [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (*(int *)((long)&pNtk->vPis + 4) != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-r     : toggles forward retiming at the beginning [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (*(int *)&pNtk->vPos != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-m     : toggles min-register retiming [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (*(int *)((long)&pNtk->vPos + 4) != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-f     : toggles the internal use of fraiging [default = %s]\n",pcVar3);
      pcVar3 = "by name";
      if (bVar1) {
        pcVar3 = "by order";
      }
      Abc_Print(-2,
                "\t-n     : toggle how CIs/COs are matched (by name or by order) [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (*(int *)((long)&pNtk->vLtlProperties + 4) != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggles verbose output [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (pNtk->nObjCounts[0] != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-w     : toggles additional verbose output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\tfile1  : (optional) the file with the first network\n");
      Abc_Print(-2,"\tfile2  : (optional) the file with the second network\n");
      Abc_Print(-2,"\t         if no files are given, uses the current network and its spec\n");
      Abc_Print(-2,"\t         if one file is given, uses the current network and the file\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDSec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Fra_Sec_t SecPar, * pSecPar = &SecPar;
    Abc_Ntk_t * pNtk, * pNtk1, * pNtk2;
    int fDelete1, fDelete2;
    char ** pArgvNew;
    int nArgcNew;
    int c;
    int fIgnoreNames;

    extern int Abc_NtkDarSec( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Fra_Sec_t * p );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Fra_SecSetDefaultParams( pSecPar );
    pSecPar->TimeLimit = 0;
    fIgnoreNames = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FTarmfnwvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pSecPar->nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pSecPar->nFramesMax < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pSecPar->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pSecPar->TimeLimit < 0 )
                goto usage;
            break;
        case 'a':
            pSecPar->fPhaseAbstract ^= 1;
            break;
        case 'r':
            pSecPar->fRetimeFirst ^= 1;
            break;
        case 'm':
            pSecPar->fRetimeRegs ^= 1;
            break;
        case 'f':
            pSecPar->fFraiging ^= 1;
            break;
        case 'n':
            fIgnoreNames ^= 1;
            break;
        case 'w':
            pSecPar->fVeryVerbose ^= 1;
            break;
        case 'v':
            pSecPar->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( !Abc_NtkPrepareTwoNtks( stdout, pNtk, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2 ) )
        return 1;
    if ( Abc_NtkLatchNum(pNtk1) == 0 || Abc_NtkLatchNum(pNtk2) == 0 )
    {
        if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
        if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
        Abc_Print( -1, "The network has no latches. Used combinational command \"cec\".\n" );
        return 0;
    }

    if ( fIgnoreNames )
    {
        if ( !fDelete1 )
        {
            pNtk1 = Abc_NtkStrash( pNtk1, 0, 1, 0 );
            fDelete1 = 1;
        }
        if ( !fDelete2 )
        {
            pNtk2 = Abc_NtkStrash( pNtk2, 0, 1, 0 );
            fDelete2 = 1;
        }
        Abc_NtkShortNames( pNtk1 );
        Abc_NtkShortNames( pNtk2 );
    }

    // perform verification
    Abc_NtkDarSec( pNtk1, pNtk2, pSecPar );

    if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
    if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
    return 0;

usage:
    Abc_Print( -2, "usage: dsec [-F num] [-T num] [-armfnwvh] <file1> <file2>\n" );
    Abc_Print( -2, "\t         performs inductive sequential equivalence checking\n" );
    Abc_Print( -2, "\t-F num : the limit on the depth of induction [default = %d]\n", pSecPar->nFramesMax );
    Abc_Print( -2, "\t-T num : the approximate runtime limit (in seconds) [default = %d]\n", pSecPar->TimeLimit );
    Abc_Print( -2, "\t-a     : toggles the use of phase abstraction [default = %s]\n", pSecPar->fPhaseAbstract? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggles forward retiming at the beginning [default = %s]\n", pSecPar->fRetimeFirst? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggles min-register retiming [default = %s]\n", pSecPar->fRetimeRegs? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggles the internal use of fraiging [default = %s]\n", pSecPar->fFraiging? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle how CIs/COs are matched (by name or by order) [default = %s]\n", fIgnoreNames? "by order": "by name" );
    Abc_Print( -2, "\t-v     : toggles verbose output [default = %s]\n", pSecPar->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggles additional verbose output [default = %s]\n", pSecPar->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile1  : (optional) the file with the first network\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second network\n");
    Abc_Print( -2, "\t         if no files are given, uses the current network and its spec\n");
    Abc_Print( -2, "\t         if one file is given, uses the current network and the file\n");
    return 1;
}